

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioply.c
# Opt level: O0

int trico_write_ply(uint32_t nr_of_vertices,float *vertices,float *vertex_normals,
                   uint32_t *vertex_colors,uint32_t nr_of_triangles,uint32_t *triangles,
                   float *texcoords,char *filename)

{
  uint local_50;
  undefined1 local_4a;
  undefined1 local_49;
  uint32_t i_1;
  uchar texcoord_size;
  undefined4 uStack_44;
  uchar tria_size;
  uint32_t i;
  int n;
  FILE *fp;
  uint32_t *triangles_local;
  uint32_t *puStack_28;
  uint32_t nr_of_triangles_local;
  uint32_t *vertex_colors_local;
  float *vertex_normals_local;
  float *vertices_local;
  uint32_t nr_of_vertices_local;
  
  if (vertices == (float *)0x0) {
    vertices_local._4_4_ = 0;
  }
  else if (nr_of_vertices == 0) {
    vertices_local._4_4_ = 0;
  }
  else {
    fp = (FILE *)triangles;
    triangles_local._4_4_ = nr_of_triangles;
    puStack_28 = vertex_colors;
    vertex_colors_local = (uint32_t *)vertex_normals;
    vertex_normals_local = vertices;
    vertices_local._0_4_ = nr_of_vertices;
    _i = fopen(filename,"wb");
    if (_i == (FILE *)0x0) {
      vertices_local._4_4_ = 0;
    }
    else {
      fprintf(_i,"ply\n");
      uStack_44 = 1;
      fprintf(_i,"format binary_little_endian 1.0\n");
      fprintf(_i,"element vertex %d\n",(ulong)(uint32_t)vertices_local);
      fprintf(_i,"property float x\n");
      fprintf(_i,"property float y\n");
      fprintf(_i,"property float z\n");
      if (vertex_colors_local != (uint32_t *)0x0) {
        fprintf(_i,"property float nx\n");
        fprintf(_i,"property float ny\n");
        fprintf(_i,"property float nz\n");
      }
      if (puStack_28 != (uint32_t *)0x0) {
        fprintf(_i,"property uchar red\n");
        fprintf(_i,"property uchar green\n");
        fprintf(_i,"property uchar blue\n");
        fprintf(_i,"property uchar alpha\n");
      }
      if ((triangles_local._4_4_ != 0) && (fp != (FILE *)0x0)) {
        fprintf(_i,"element face %d\n",(ulong)triangles_local._4_4_);
        fprintf(_i,"property list uchar int vertex_indices\n");
        if (texcoords != (float *)0x0) {
          fprintf(_i,"property list uchar float texcoord\n");
        }
      }
      fprintf(_i,"end_header\n");
      for (i_1 = 0; i_1 < (uint32_t)vertices_local; i_1 = i_1 + 1) {
        fwrite(vertex_normals_local + i_1 * 3,4,3,_i);
        if (vertex_colors_local != (uint32_t *)0x0) {
          fwrite(vertex_colors_local + i_1 * 3,4,3,_i);
        }
        if (puStack_28 != (uint32_t *)0x0) {
          fwrite(puStack_28 + i_1,4,1,_i);
        }
      }
      local_49 = 3;
      local_4a = 6;
      for (local_50 = 0; local_50 < triangles_local._4_4_; local_50 = local_50 + 1) {
        fwrite(&local_49,1,1,_i);
        fwrite(&fp->_flags + local_50 * 3,4,3,_i);
        if (texcoords != (float *)0x0) {
          fwrite(&local_4a,1,1,_i);
          fwrite(texcoords + local_50 * 6,4,6,_i);
        }
      }
      fclose(_i);
      vertices_local._4_4_ = 1;
    }
  }
  return vertices_local._4_4_;
}

Assistant:

int trico_write_ply(const uint32_t nr_of_vertices, const float* vertices, const float* vertex_normals, const uint32_t* vertex_colors, const uint32_t nr_of_triangles, const uint32_t* triangles, const float* texcoords, const char* filename)
  {
  if (!vertices)
    return 0;
  if (nr_of_vertices == 0)
    return 0;

  FILE* fp = fopen(filename, "wb");

  if (!fp)
    return 0;

  fprintf(fp, "ply\n");
  int n = 1;
  if (*(char *)&n == 1)
    fprintf(fp, "format binary_little_endian 1.0\n");
  else
    fprintf(fp, "format binary_big_endian 1.0\n");

  fprintf(fp, "element vertex %d\n", nr_of_vertices);
  fprintf(fp, "property float x\n");
  fprintf(fp, "property float y\n");
  fprintf(fp, "property float z\n");

  if (vertex_normals)
    {
    fprintf(fp, "property float nx\n");
    fprintf(fp, "property float ny\n");
    fprintf(fp, "property float nz\n");
    }

  if (vertex_colors)
    {
    fprintf(fp, "property uchar red\n");
    fprintf(fp, "property uchar green\n");
    fprintf(fp, "property uchar blue\n");
    fprintf(fp, "property uchar alpha\n");
    }

  if (nr_of_triangles && triangles)
    {
    fprintf(fp, "element face %d\n", nr_of_triangles);
    fprintf(fp, "property list uchar int vertex_indices\n");
    if (texcoords)
      fprintf(fp, "property list uchar float texcoord\n");
    }
  fprintf(fp, "end_header\n");

  for (uint32_t i = 0; i < nr_of_vertices; ++i)
    {
    fwrite(vertices + 3 * i, sizeof(float), 3, fp);
    if (vertex_normals)
      fwrite(vertex_normals + 3 * i, sizeof(float), 3, fp);
    if (vertex_colors)
      fwrite(vertex_colors + i, sizeof(uint32_t), 1, fp);
    }
  const unsigned char tria_size = 3;
  const unsigned char texcoord_size = 6;
  for (uint32_t i = 0; i < nr_of_triangles; ++i)
    {
    fwrite(&tria_size, 1, 1, fp);
    fwrite(triangles + 3 * i, sizeof(uint32_t), 3, fp);
    if (texcoords)
      {
      fwrite(&texcoord_size, 1, 1, fp);
      fwrite(texcoords + 6 * i, sizeof(float), 6, fp);
      }
    }
  fclose(fp);
  return 1;
  }